

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O2

void __thiscall
TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::~TPZAutoPointer
          (TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *this)

{
  bool bVar1;
  
  if (this->fRef != (TPZReference *)0x0) {
    bVar1 = TPZReference::Decrease(this->fRef);
    if (bVar1) {
      Release(this);
      return;
    }
  }
  return;
}

Assistant:

~TPZAutoPointer()
	{        
        if (fRef && fRef->Decrease()){
            Release();
        }
	}